

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack5_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar12 [64];
  
  uVar1 = *(ulong *)in;
  auVar8 = vpmovsxbd_avx512f(_DAT_00185430);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar4 = vpshufd_avx(auVar5,0x50);
  auVar6 = vpbroadcastd_avx512vl();
  auVar2 = vpermq_avx2(ZEXT1632(auVar4),0x40);
  auVar2 = vpsrlvd_avx2(auVar2,_DAT_0018ddc0);
  auVar7._8_4_ = 0x1c;
  auVar7._0_8_ = 0x1c0000001c;
  auVar7._12_4_ = 0x1c;
  auVar7._16_4_ = 0x1c;
  auVar7._20_4_ = 0x1c;
  auVar7._24_4_ = 0x1c;
  auVar7._28_4_ = 0x1c;
  auVar7 = vpandd_avx512vl(auVar6,auVar7);
  auVar2 = vpblendd_avx2(auVar2,auVar7,0x20);
  auVar4 = vpshufd_avx(auVar5,0x55);
  auVar4 = vpinsrd_avx(auVar4,in[2] << 4,1);
  auVar8 = vpermi2d_avx512f(auVar8,ZEXT3264(auVar2),ZEXT864(uVar1));
  auVar10 = vpmovsxbd_avx512f(_DAT_00185440);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar5 = vpshufd_avx(auVar14,0xc5);
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_00190f70);
  auVar4 = vpshufd_avx(auVar4,0x40);
  auVar14 = vpsrlvd_avx2(auVar4,_DAT_0019de30);
  auVar3._8_4_ = 0x10;
  auVar3._0_8_ = 0x1000000010;
  auVar3._12_4_ = 0x10;
  auVar4 = vpandd_avx512vl(auVar4,auVar3);
  auVar11 = vshufi64x2_avx512f(ZEXT1664(auVar5),ZEXT1664(auVar5),0);
  auVar4 = vpblendd_avx2(auVar14,auVar4,8);
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_00191eb0);
  auVar10 = vpermi2d_avx512f(auVar10,auVar8,ZEXT1664(auVar4));
  auVar8 = vmovdqa64_avx512f(auVar10);
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_52_ = auVar8._0_52_;
  auVar13._52_4_ = auVar12._52_4_;
  auVar13._56_4_ = auVar8._56_4_;
  auVar13._60_4_ = auVar8._60_4_;
  auVar9 = vpermi2q_avx512f(auVar9,auVar13,ZEXT1664(auVar5));
  auVar8._8_4_ = 0x1f;
  auVar8._0_8_ = 0x1f0000001f;
  auVar8._12_4_ = 0x1f;
  auVar8._16_4_ = 0x1f;
  auVar8._20_4_ = 0x1f;
  auVar8._24_4_ = 0x1f;
  auVar8._28_4_ = 0x1f;
  auVar8._32_4_ = 0x1f;
  auVar8._36_4_ = 0x1f;
  auVar8._40_4_ = 0x1f;
  auVar8._44_4_ = 0x1f;
  auVar8._48_4_ = 0x1f;
  auVar8._52_4_ = 0x1f;
  auVar8._56_4_ = 0x1f;
  auVar8._60_4_ = 0x1f;
  auVar8 = vpandd_avx512f(auVar9,auVar8);
  auVar9 = vpord_avx512f(auVar10,auVar11);
  auVar10._0_24_ = auVar8._0_24_;
  auVar10._24_4_ = auVar9._24_4_;
  auVar10._28_4_ = auVar8._28_4_;
  auVar10._32_4_ = auVar8._32_4_;
  auVar10._36_4_ = auVar8._36_4_;
  auVar10._40_4_ = auVar8._40_4_;
  auVar10._44_4_ = auVar8._44_4_;
  auVar10._48_4_ = auVar9._48_4_;
  auVar10._52_4_ = auVar8._52_4_;
  auVar10._56_4_ = auVar8._56_4_;
  auVar10._60_4_ = auVar8._60_4_;
  auVar8 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])out = auVar8;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack5_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 5);
  out++;
  *out = ((*in) >> 5) % (1U << 5);
  out++;
  *out = ((*in) >> 10) % (1U << 5);
  out++;
  *out = ((*in) >> 15) % (1U << 5);
  out++;
  *out = ((*in) >> 20) % (1U << 5);
  out++;
  *out = ((*in) >> 25) % (1U << 5);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 3)) << (5 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 5);
  out++;
  *out = ((*in) >> 8) % (1U << 5);
  out++;
  *out = ((*in) >> 13) % (1U << 5);
  out++;
  *out = ((*in) >> 18) % (1U << 5);
  out++;
  *out = ((*in) >> 23) % (1U << 5);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 1)) << (5 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 5);
  out++;
  *out = ((*in) >> 6) % (1U << 5);
  out++;
  *out = ((*in) >> 11) % (1U << 5);
  out++;

  return in + 1;
}